

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn2612.c
# Opt level: O3

void ym2612_update_one(void *chip,UINT32 length,DEV_SMPL **buffer)

{
  FM_OPN2 *OPN;
  FM_CH *CH;
  FM_CH *CH_00;
  FM_CH *CH_01;
  FM_CH *CH_02;
  FM_CH *CH_03;
  FM_CH *CH_04;
  undefined1 (*pauVar1) [16];
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  UINT8 UVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  UINT8 UVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  FM_SLOT *SLOT;
  DEV_SMPL *local_78;
  DEV_SMPL *local_70;
  
  iVar4 = 0;
  if (buffer == (DEV_SMPL **)0x0) {
    local_70 = (DEV_SMPL *)0x0;
    local_78 = (DEV_SMPL *)0x0;
  }
  else {
    local_78 = *buffer;
    local_70 = buffer[1];
  }
  OPN = (FM_OPN2 *)((long)chip + 0x208);
  CH = (FM_CH *)((long)chip + 0x4718);
  CH_00 = (FM_CH *)((long)chip + 0x48b0);
  if (*(char *)((long)chip + 0x50b0) == '\0') {
    iVar4 = *(int *)((long)chip + 0x50ac) << 5;
  }
  CH_01 = (FM_CH *)((long)chip + 0x4a48);
  CH_02 = (FM_CH *)((long)chip + 0x4be0);
  CH_03 = (FM_CH *)((long)chip + 0x4d78);
  CH_04 = (FM_CH *)((long)chip + 0x4f10);
  refresh_fc_eg_chan(OPN,CH);
  refresh_fc_eg_chan(OPN,CH_00);
  if ((*(byte *)((long)chip + 0x234) & 0xc0) == 0) {
    refresh_fc_eg_chan(OPN,CH_01);
  }
  else if (*(int *)((long)chip + 0x4a70) == -1) {
    bVar8 = *(byte *)((long)chip + 0x676) >> (*(byte *)((long)chip + 0x4a50) & 0x1f);
    uVar5 = (uint)bVar8;
    iVar9 = *(int *)(*(long *)((long)chip + 0x4a48) + (ulong)*(byte *)((long)chip + 0x676) * 4) +
            *(int *)((long)chip + 0x66c);
    if (iVar9 < 0) {
      iVar9 = iVar9 + *(int *)((long)chip + 0x46d0);
    }
    *(uint *)((long)chip + 0x4a70) = (uint)(iVar9 * *(int *)((long)chip + 0x4a68)) >> 1;
    if (uVar5 != *(byte *)((long)chip + 0x4a64)) {
      *(byte *)((long)chip + 0x4a64) = bVar8;
      uVar12 = *(int *)((long)chip + 0x4a54) + uVar5;
      if (uVar12 < 0x5e) {
        UVar7 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                [uVar12];
        UVar14 = eg_rate_select[uVar12];
      }
      else {
        UVar14 = 0x90;
        UVar7 = '\0';
      }
      *(UINT8 *)((long)chip + 0x4a88) = UVar7;
      *(UINT8 *)((long)chip + 0x4a89) = UVar14;
      uVar12 = *(int *)((long)chip + 0x4a58) + uVar5;
      *(UINT8 *)((long)chip + 0x4a8a) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar12];
      uVar16 = *(int *)((long)chip + 0x4a5c) + uVar5;
      *(UINT8 *)((long)chip + 0x4a8c) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar16];
      uVar5 = uVar5 + *(int *)((long)chip + 0x4a60);
      *(UINT8 *)((long)chip + 0x4a8e) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar5];
      *(UINT8 *)((long)chip + 0x4a8b) = eg_rate_select[uVar12];
      *(UINT8 *)((long)chip + 0x4a8d) = eg_rate_select[uVar16];
      *(UINT8 *)((long)chip + 0x4a8f) = eg_rate_select[uVar5];
    }
    bVar8 = *(byte *)((long)chip + 0x677) >> (*(byte *)((long)chip + 0x4af0) & 0x1f);
    uVar5 = (uint)bVar8;
    iVar9 = *(int *)(*(long *)((long)chip + 0x4ae8) + (ulong)*(byte *)((long)chip + 0x677) * 4) +
            *(int *)((long)chip + 0x670);
    if (iVar9 < 0) {
      iVar9 = iVar9 + *(int *)((long)chip + 0x46d0);
    }
    *(uint *)((long)chip + 0x4b10) = (uint)(iVar9 * *(int *)((long)chip + 0x4b08)) >> 1;
    if (uVar5 != *(byte *)((long)chip + 0x4b04)) {
      *(byte *)((long)chip + 0x4b04) = bVar8;
      uVar12 = *(int *)((long)chip + 0x4af4) + uVar5;
      if (uVar12 < 0x5e) {
        UVar7 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                [uVar12];
        UVar14 = eg_rate_select[uVar12];
      }
      else {
        UVar14 = 0x90;
        UVar7 = '\0';
      }
      *(UINT8 *)((long)chip + 0x4b28) = UVar7;
      *(UINT8 *)((long)chip + 0x4b29) = UVar14;
      uVar12 = *(int *)((long)chip + 0x4af8) + uVar5;
      *(UINT8 *)((long)chip + 0x4b2a) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar12];
      uVar16 = *(int *)((long)chip + 0x4afc) + uVar5;
      *(UINT8 *)((long)chip + 0x4b2c) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar16];
      uVar5 = uVar5 + *(int *)((long)chip + 0x4b00);
      *(UINT8 *)((long)chip + 0x4b2e) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar5];
      *(UINT8 *)((long)chip + 0x4b2b) = eg_rate_select[uVar12];
      *(UINT8 *)((long)chip + 0x4b2d) = eg_rate_select[uVar16];
      *(UINT8 *)((long)chip + 0x4b2f) = eg_rate_select[uVar5];
    }
    bVar8 = *(byte *)((long)chip + 0x675) >> (*(byte *)((long)chip + 0x4aa0) & 0x1f);
    uVar5 = (uint)bVar8;
    iVar9 = *(int *)(*(long *)((long)chip + 0x4a98) + (ulong)*(byte *)((long)chip + 0x675) * 4) +
            *(int *)((long)chip + 0x668);
    if (iVar9 < 0) {
      iVar9 = iVar9 + *(int *)((long)chip + 0x46d0);
    }
    *(uint *)((long)chip + 0x4ac0) = (uint)(iVar9 * *(int *)((long)chip + 0x4ab8)) >> 1;
    if (uVar5 != *(byte *)((long)chip + 0x4ab4)) {
      *(byte *)((long)chip + 0x4ab4) = bVar8;
      uVar12 = *(int *)((long)chip + 0x4aa4) + uVar5;
      if (uVar12 < 0x5e) {
        UVar7 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                [uVar12];
        UVar14 = eg_rate_select[uVar12];
      }
      else {
        UVar14 = 0x90;
        UVar7 = '\0';
      }
      *(UINT8 *)((long)chip + 0x4ad8) = UVar7;
      *(UINT8 *)((long)chip + 0x4ad9) = UVar14;
      uVar12 = *(int *)((long)chip + 0x4aa8) + uVar5;
      *(UINT8 *)((long)chip + 0x4ada) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar12];
      uVar16 = *(int *)((long)chip + 0x4aac) + uVar5;
      *(UINT8 *)((long)chip + 0x4adc) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar16];
      uVar5 = uVar5 + *(int *)((long)chip + 0x4ab0);
      *(UINT8 *)((long)chip + 0x4ade) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar5];
      *(UINT8 *)((long)chip + 0x4adb) = eg_rate_select[uVar12];
      *(UINT8 *)((long)chip + 0x4add) = eg_rate_select[uVar16];
      *(UINT8 *)((long)chip + 0x4adf) = eg_rate_select[uVar5];
    }
    bVar8 = *(byte *)((long)chip + 0x4bd0) >> (*(byte *)((long)chip + 0x4b40) & 0x1f);
    uVar5 = (uint)bVar8;
    iVar9 = *(int *)(*(long *)((long)chip + 0x4b38) + (ulong)*(byte *)((long)chip + 0x4bd0) * 4) +
            *(int *)((long)chip + 0x4bcc);
    if (iVar9 < 0) {
      iVar9 = iVar9 + *(int *)((long)chip + 0x46d0);
    }
    *(uint *)((long)chip + 0x4b60) = (uint)(iVar9 * *(int *)((long)chip + 0x4b58)) >> 1;
    if (uVar5 != *(byte *)((long)chip + 0x4b54)) {
      *(byte *)((long)chip + 0x4b54) = bVar8;
      uVar12 = *(int *)((long)chip + 0x4b44) + uVar5;
      if (uVar12 < 0x5e) {
        UVar7 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                [uVar12];
        UVar14 = eg_rate_select[uVar12];
      }
      else {
        UVar14 = 0x90;
        UVar7 = '\0';
      }
      *(UINT8 *)((long)chip + 0x4b78) = UVar7;
      *(UINT8 *)((long)chip + 0x4b79) = UVar14;
      uVar12 = *(int *)((long)chip + 0x4b48) + uVar5;
      *(UINT8 *)((long)chip + 0x4b7a) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar12];
      uVar16 = *(int *)((long)chip + 0x4b4c) + uVar5;
      *(UINT8 *)((long)chip + 0x4b7c) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar16];
      uVar5 = uVar5 + *(int *)((long)chip + 0x4b50);
      *(UINT8 *)((long)chip + 0x4b7e) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar5];
      *(UINT8 *)((long)chip + 0x4b7b) = eg_rate_select[uVar12];
      *(UINT8 *)((long)chip + 0x4b7d) = eg_rate_select[uVar16];
      *(UINT8 *)((long)chip + 0x4b7f) = eg_rate_select[uVar5];
    }
  }
  refresh_fc_eg_chan(OPN,CH_02);
  refresh_fc_eg_chan(OPN,CH_03);
  refresh_fc_eg_chan(OPN,CH_04);
  if (length == 0) {
    lVar6 = 0;
    do {
      bVar8 = *(byte *)((long)chip + lVar6 + 0x4760);
      if ((((bVar8 & 8) != 0) &&
          (uVar5 = *(uint *)((long)chip + lVar6 + 0x474c), 0x1ff < (int)uVar5)) &&
         (bVar15 = *(byte *)((long)chip + lVar6 + 0x4744), 1 < bVar15)) {
        if ((bVar8 & 1) == 0) {
          if ((bVar8 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x473c) = 0;
          }
          else {
            pbVar2 = (byte *)((long)chip + lVar6 + 0x4761);
            *pbVar2 = *pbVar2 ^ 4;
          }
          if (bVar15 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x4734) + *(int *)((long)chip + lVar6 + 0x4724)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x4744) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x474c) = 0;
              *(byte *)((long)chip + lVar6 + 0x4744) =
                   *(int *)((long)chip + lVar6 + 0x4750) == 0 ^ 3;
              uVar5 = 0;
            }
          }
        }
        else {
          if ((bVar8 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x4761) = 4;
          }
          if ((bVar15 != 4) && (*(byte *)((long)chip + lVar6 + 0x4761) == (bVar8 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x474c) = 0x3ff;
            uVar5 = 0x3ff;
          }
        }
        uVar12 = 0x200 - uVar5 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x4761) == (bVar8 & 4)) {
          uVar12 = uVar5;
        }
        *(uint *)((long)chip + lVar6 + 0x4754) = uVar12 + *(int *)((long)chip + lVar6 + 0x4748);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
    lVar6 = 0;
    do {
      bVar8 = *(byte *)((long)chip + lVar6 + 0x48f8);
      if ((((bVar8 & 8) != 0) &&
          (uVar5 = *(uint *)((long)chip + lVar6 + 0x48e4), 0x1ff < (int)uVar5)) &&
         (bVar15 = *(byte *)((long)chip + lVar6 + 0x48dc), 1 < bVar15)) {
        if ((bVar8 & 1) == 0) {
          if ((bVar8 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x48d4) = 0;
          }
          else {
            pbVar2 = (byte *)((long)chip + lVar6 + 0x48f9);
            *pbVar2 = *pbVar2 ^ 4;
          }
          if (bVar15 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x48cc) + *(int *)((long)chip + lVar6 + 0x48bc)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x48dc) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x48e4) = 0;
              *(byte *)((long)chip + lVar6 + 0x48dc) =
                   *(int *)((long)chip + lVar6 + 0x48e8) == 0 ^ 3;
              uVar5 = 0;
            }
          }
        }
        else {
          if ((bVar8 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x48f9) = 4;
          }
          if ((bVar15 != 4) && (*(byte *)((long)chip + lVar6 + 0x48f9) == (bVar8 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x48e4) = 0x3ff;
            uVar5 = 0x3ff;
          }
        }
        uVar12 = 0x200 - uVar5 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x48f9) == (bVar8 & 4)) {
          uVar12 = uVar5;
        }
        *(uint *)((long)chip + lVar6 + 0x48ec) = uVar12 + *(int *)((long)chip + lVar6 + 0x48e0);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
    lVar6 = 0;
    do {
      bVar8 = *(byte *)((long)chip + lVar6 + 0x4a90);
      if ((((bVar8 & 8) != 0) &&
          (uVar5 = *(uint *)((long)chip + lVar6 + 0x4a7c), 0x1ff < (int)uVar5)) &&
         (bVar15 = *(byte *)((long)chip + lVar6 + 0x4a74), 1 < bVar15)) {
        if ((bVar8 & 1) == 0) {
          if ((bVar8 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x4a6c) = 0;
          }
          else {
            pbVar2 = (byte *)((long)chip + lVar6 + 0x4a91);
            *pbVar2 = *pbVar2 ^ 4;
          }
          if (bVar15 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x4a64) + *(int *)((long)chip + lVar6 + 0x4a54)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x4a74) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x4a7c) = 0;
              *(byte *)((long)chip + lVar6 + 0x4a74) =
                   *(int *)((long)chip + lVar6 + 0x4a80) == 0 ^ 3;
              uVar5 = 0;
            }
          }
        }
        else {
          if ((bVar8 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x4a91) = 4;
          }
          if ((bVar15 != 4) && (*(byte *)((long)chip + lVar6 + 0x4a91) == (bVar8 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x4a7c) = 0x3ff;
            uVar5 = 0x3ff;
          }
        }
        uVar12 = 0x200 - uVar5 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x4a91) == (bVar8 & 4)) {
          uVar12 = uVar5;
        }
        *(uint *)((long)chip + lVar6 + 0x4a84) = uVar12 + *(int *)((long)chip + lVar6 + 0x4a78);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
    lVar6 = 0;
    do {
      bVar8 = *(byte *)((long)chip + lVar6 + 0x4c28);
      if ((((bVar8 & 8) != 0) &&
          (uVar5 = *(uint *)((long)chip + lVar6 + 0x4c14), 0x1ff < (int)uVar5)) &&
         (bVar15 = *(byte *)((long)chip + lVar6 + 0x4c0c), 1 < bVar15)) {
        if ((bVar8 & 1) == 0) {
          if ((bVar8 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x4c04) = 0;
          }
          else {
            pbVar2 = (byte *)((long)chip + lVar6 + 0x4c29);
            *pbVar2 = *pbVar2 ^ 4;
          }
          if (bVar15 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x4bfc) + *(int *)((long)chip + lVar6 + 0x4bec)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x4c0c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x4c14) = 0;
              *(byte *)((long)chip + lVar6 + 0x4c0c) =
                   *(int *)((long)chip + lVar6 + 0x4c18) == 0 ^ 3;
              uVar5 = 0;
            }
          }
        }
        else {
          if ((bVar8 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x4c29) = 4;
          }
          if ((bVar15 != 4) && (*(byte *)((long)chip + lVar6 + 0x4c29) == (bVar8 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x4c14) = 0x3ff;
            uVar5 = 0x3ff;
          }
        }
        uVar12 = 0x200 - uVar5 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x4c29) == (bVar8 & 4)) {
          uVar12 = uVar5;
        }
        *(uint *)((long)chip + lVar6 + 0x4c1c) = uVar12 + *(int *)((long)chip + lVar6 + 0x4c10);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
    lVar6 = 0;
    do {
      bVar8 = *(byte *)((long)chip + lVar6 + 0x4dc0);
      if ((((bVar8 & 8) != 0) &&
          (uVar5 = *(uint *)((long)chip + lVar6 + 0x4dac), 0x1ff < (int)uVar5)) &&
         (bVar15 = *(byte *)((long)chip + lVar6 + 0x4da4), 1 < bVar15)) {
        if ((bVar8 & 1) == 0) {
          if ((bVar8 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x4d9c) = 0;
          }
          else {
            pbVar2 = (byte *)((long)chip + lVar6 + 0x4dc1);
            *pbVar2 = *pbVar2 ^ 4;
          }
          if (bVar15 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x4d94) + *(int *)((long)chip + lVar6 + 0x4d84)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x4da4) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x4dac) = 0;
              *(byte *)((long)chip + lVar6 + 0x4da4) =
                   *(int *)((long)chip + lVar6 + 0x4db0) == 0 ^ 3;
              uVar5 = 0;
            }
          }
        }
        else {
          if ((bVar8 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x4dc1) = 4;
          }
          if ((bVar15 != 4) && (*(byte *)((long)chip + lVar6 + 0x4dc1) == (bVar8 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x4dac) = 0x3ff;
            uVar5 = 0x3ff;
          }
        }
        uVar12 = 0x200 - uVar5 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x4dc1) == (bVar8 & 4)) {
          uVar12 = uVar5;
        }
        *(uint *)((long)chip + lVar6 + 0x4db4) = uVar12 + *(int *)((long)chip + lVar6 + 0x4da8);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
    lVar6 = 0;
    do {
      bVar8 = *(byte *)((long)chip + lVar6 + 0x4f58);
      if ((((bVar8 & 8) != 0) &&
          (uVar5 = *(uint *)((long)chip + lVar6 + 0x4f44), 0x1ff < (int)uVar5)) &&
         (bVar15 = *(byte *)((long)chip + lVar6 + 0x4f3c), 1 < bVar15)) {
        if ((bVar8 & 1) == 0) {
          if ((bVar8 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x4f34) = 0;
          }
          else {
            pbVar2 = (byte *)((long)chip + lVar6 + 0x4f59);
            *pbVar2 = *pbVar2 ^ 4;
          }
          if (bVar15 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x4f2c) + *(int *)((long)chip + lVar6 + 0x4f1c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x4f3c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x4f44) = 0;
              *(byte *)((long)chip + lVar6 + 0x4f3c) =
                   *(int *)((long)chip + lVar6 + 0x4f48) == 0 ^ 3;
              uVar5 = 0;
            }
          }
        }
        else {
          if ((bVar8 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x4f59) = 4;
          }
          if ((bVar15 != 4) && (*(byte *)((long)chip + lVar6 + 0x4f59) == (bVar8 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x4f44) = 0x3ff;
            uVar5 = 0x3ff;
          }
        }
        uVar12 = 0x200 - uVar5 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x4f59) == (bVar8 & 4)) {
          uVar12 = uVar5;
        }
        *(uint *)((long)chip + lVar6 + 0x4f4c) = uVar12 + *(int *)((long)chip + lVar6 + 0x4f40);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
  }
  else {
    pauVar1 = (undefined1 (*) [16])((long)chip + 0x46fc);
    uVar18 = 0;
    do {
      *pauVar1 = (undefined1  [16])0x0;
      *(undefined8 *)((long)chip + 0x470c) = 0;
      lVar6 = 0x4761;
      do {
        bVar8 = *(byte *)((long)chip + lVar6 + -1);
        if ((((bVar8 & 8) != 0) &&
            (uVar5 = *(uint *)((long)chip + lVar6 + -0x15), 0x1ff < (int)uVar5)) &&
           (bVar15 = *(byte *)((long)chip + lVar6 + -0x1d), 1 < bVar15)) {
          if ((bVar8 & 1) == 0) {
            if ((bVar8 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + -0x25) = 0;
            }
            else {
              *(byte *)((long)chip + lVar6) = *(byte *)((long)chip + lVar6) ^ 4;
            }
            if (bVar15 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + -0x2d) + *(int *)((long)chip + lVar6 + -0x3d)
                  < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + -0x1d) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + -0x15) = 0;
                *(byte *)((long)chip + lVar6 + -0x1d) =
                     *(int *)((long)chip + lVar6 + -0x11) == 0 ^ 3;
                uVar5 = 0;
              }
            }
          }
          else {
            if ((bVar8 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6) = 4;
            }
            if ((bVar15 != 4) && (*(byte *)((long)chip + lVar6) == (bVar8 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + -0x15) = 0x3ff;
              uVar5 = 0x3ff;
            }
          }
          uVar12 = 0x200 - uVar5 & 0x3ff;
          if (*(byte *)((long)chip + lVar6) == (bVar8 & 4)) {
            uVar12 = uVar5;
          }
          *(uint *)((long)chip + lVar6 + -0xd) = uVar12 + *(int *)((long)chip + lVar6 + -0x19);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x48a1);
      lVar6 = 0x48f9;
      do {
        bVar8 = *(byte *)((long)chip + lVar6 + -1);
        if ((((bVar8 & 8) != 0) &&
            (uVar5 = *(uint *)((long)chip + lVar6 + -0x15), 0x1ff < (int)uVar5)) &&
           (bVar15 = *(byte *)((long)chip + lVar6 + -0x1d), 1 < bVar15)) {
          if ((bVar8 & 1) == 0) {
            if ((bVar8 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + -0x25) = 0;
            }
            else {
              *(byte *)((long)chip + lVar6) = *(byte *)((long)chip + lVar6) ^ 4;
            }
            if (bVar15 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + -0x2d) + *(int *)((long)chip + lVar6 + -0x3d)
                  < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + -0x1d) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + -0x15) = 0;
                *(byte *)((long)chip + lVar6 + -0x1d) =
                     *(int *)((long)chip + lVar6 + -0x11) == 0 ^ 3;
                uVar5 = 0;
              }
            }
          }
          else {
            if ((bVar8 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6) = 4;
            }
            if ((bVar15 != 4) && (*(byte *)((long)chip + lVar6) == (bVar8 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + -0x15) = 0x3ff;
              uVar5 = 0x3ff;
            }
          }
          uVar12 = 0x200 - uVar5 & 0x3ff;
          if (*(byte *)((long)chip + lVar6) == (bVar8 & 4)) {
            uVar12 = uVar5;
          }
          *(uint *)((long)chip + lVar6 + -0xd) = uVar12 + *(int *)((long)chip + lVar6 + -0x19);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x4a39);
      lVar6 = 0x4a91;
      do {
        bVar8 = *(byte *)((long)chip + lVar6 + -1);
        if ((((bVar8 & 8) != 0) &&
            (uVar5 = *(uint *)((long)chip + lVar6 + -0x15), 0x1ff < (int)uVar5)) &&
           (bVar15 = *(byte *)((long)chip + lVar6 + -0x1d), 1 < bVar15)) {
          if ((bVar8 & 1) == 0) {
            if ((bVar8 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + -0x25) = 0;
            }
            else {
              *(byte *)((long)chip + lVar6) = *(byte *)((long)chip + lVar6) ^ 4;
            }
            if (bVar15 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + -0x2d) + *(int *)((long)chip + lVar6 + -0x3d)
                  < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + -0x1d) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + -0x15) = 0;
                *(byte *)((long)chip + lVar6 + -0x1d) =
                     *(int *)((long)chip + lVar6 + -0x11) == 0 ^ 3;
                uVar5 = 0;
              }
            }
          }
          else {
            if ((bVar8 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6) = 4;
            }
            if ((bVar15 != 4) && (*(byte *)((long)chip + lVar6) == (bVar8 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + -0x15) = 0x3ff;
              uVar5 = 0x3ff;
            }
          }
          uVar12 = 0x200 - uVar5 & 0x3ff;
          if (*(byte *)((long)chip + lVar6) == (bVar8 & 4)) {
            uVar12 = uVar5;
          }
          *(uint *)((long)chip + lVar6 + -0xd) = uVar12 + *(int *)((long)chip + lVar6 + -0x19);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x4bd1);
      lVar6 = 0x4c29;
      do {
        bVar8 = *(byte *)((long)chip + lVar6 + -1);
        if ((((bVar8 & 8) != 0) &&
            (uVar5 = *(uint *)((long)chip + lVar6 + -0x15), 0x1ff < (int)uVar5)) &&
           (bVar15 = *(byte *)((long)chip + lVar6 + -0x1d), 1 < bVar15)) {
          if ((bVar8 & 1) == 0) {
            if ((bVar8 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + -0x25) = 0;
            }
            else {
              *(byte *)((long)chip + lVar6) = *(byte *)((long)chip + lVar6) ^ 4;
            }
            if (bVar15 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + -0x2d) + *(int *)((long)chip + lVar6 + -0x3d)
                  < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + -0x1d) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + -0x15) = 0;
                *(byte *)((long)chip + lVar6 + -0x1d) =
                     *(int *)((long)chip + lVar6 + -0x11) == 0 ^ 3;
                uVar5 = 0;
              }
            }
          }
          else {
            if ((bVar8 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6) = 4;
            }
            if ((bVar15 != 4) && (*(byte *)((long)chip + lVar6) == (bVar8 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + -0x15) = 0x3ff;
              uVar5 = 0x3ff;
            }
          }
          uVar12 = 0x200 - uVar5 & 0x3ff;
          if (*(byte *)((long)chip + lVar6) == (bVar8 & 4)) {
            uVar12 = uVar5;
          }
          *(uint *)((long)chip + lVar6 + -0xd) = uVar12 + *(int *)((long)chip + lVar6 + -0x19);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x4d69);
      lVar6 = 0x4dc1;
      do {
        bVar8 = *(byte *)((long)chip + lVar6 + -1);
        if ((((bVar8 & 8) != 0) &&
            (uVar5 = *(uint *)((long)chip + lVar6 + -0x15), 0x1ff < (int)uVar5)) &&
           (bVar15 = *(byte *)((long)chip + lVar6 + -0x1d), 1 < bVar15)) {
          if ((bVar8 & 1) == 0) {
            if ((bVar8 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + -0x25) = 0;
            }
            else {
              *(byte *)((long)chip + lVar6) = *(byte *)((long)chip + lVar6) ^ 4;
            }
            if (bVar15 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + -0x2d) + *(int *)((long)chip + lVar6 + -0x3d)
                  < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + -0x1d) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + -0x15) = 0;
                *(byte *)((long)chip + lVar6 + -0x1d) =
                     *(int *)((long)chip + lVar6 + -0x11) == 0 ^ 3;
                uVar5 = 0;
              }
            }
          }
          else {
            if ((bVar8 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6) = 4;
            }
            if ((bVar15 != 4) && (*(byte *)((long)chip + lVar6) == (bVar8 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + -0x15) = 0x3ff;
              uVar5 = 0x3ff;
            }
          }
          uVar12 = 0x200 - uVar5 & 0x3ff;
          if (*(byte *)((long)chip + lVar6) == (bVar8 & 4)) {
            uVar12 = uVar5;
          }
          *(uint *)((long)chip + lVar6 + -0xd) = uVar12 + *(int *)((long)chip + lVar6 + -0x19);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x4f01);
      lVar6 = 0x4f59;
      do {
        bVar8 = *(byte *)((long)chip + lVar6 + -1);
        if ((((bVar8 & 8) != 0) &&
            (uVar5 = *(uint *)((long)chip + lVar6 + -0x15), 0x1ff < (int)uVar5)) &&
           (bVar15 = *(byte *)((long)chip + lVar6 + -0x1d), 1 < bVar15)) {
          if ((bVar8 & 1) == 0) {
            if ((bVar8 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + -0x25) = 0;
            }
            else {
              *(byte *)((long)chip + lVar6) = *(byte *)((long)chip + lVar6) ^ 4;
            }
            if (bVar15 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + -0x2d) + *(int *)((long)chip + lVar6 + -0x3d)
                  < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + -0x1d) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + -0x15) = 0;
                *(byte *)((long)chip + lVar6 + -0x1d) =
                     *(int *)((long)chip + lVar6 + -0x11) == 0 ^ 3;
                uVar5 = 0;
              }
            }
          }
          else {
            if ((bVar8 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6) = 4;
            }
            if ((bVar15 != 4) && (*(byte *)((long)chip + lVar6) == (bVar8 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + -0x15) = 0x3ff;
              uVar5 = 0x3ff;
            }
          }
          uVar12 = 0x200 - uVar5 & 0x3ff;
          if (*(byte *)((long)chip + lVar6) == (bVar8 & 4)) {
            uVar12 = uVar5;
          }
          *(uint *)((long)chip + lVar6 + -0xd) = uVar12 + *(int *)((long)chip + lVar6 + -0x19);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x5099);
      if (*(char *)((long)chip + 0x50aa) == '\0') {
        chan_calc((YM2612 *)chip,OPN,CH);
        chan_calc((YM2612 *)chip,OPN,CH_00);
        chan_calc((YM2612 *)chip,OPN,CH_01);
        chan_calc((YM2612 *)chip,OPN,CH_02);
        chan_calc((YM2612 *)chip,OPN,CH_03);
        if (*(char *)((long)chip + 0x50a9) == '\0') {
          chan_calc((YM2612 *)chip,OPN,CH_04);
        }
        else {
          **(int **)((long)chip + 0x5078) = **(int **)((long)chip + 0x5078) + iVar4;
        }
      }
      else {
        *(ulong *)((long)chip + 0x46fc) = CONCAT44(iVar4,iVar4);
        *(ulong *)((long)chip + 0x4704) = CONCAT44(iVar4,iVar4);
        *(int *)((long)chip + 0x4710) = iVar4;
      }
      uVar5 = *(uint *)((long)chip + 0x46e0);
      if (uVar5 != 0) {
        uVar12 = *(int *)((long)chip + 0x46d8) + *(int *)((long)chip + 0x46dc);
        *(uint *)((long)chip + 0x46d8) = uVar12;
        if (uVar5 <= uVar12) {
          bVar8 = *(byte *)((long)chip + 0x46d4);
          do {
            uVar12 = uVar12 - uVar5;
            bVar15 = bVar8 + 1;
            bVar8 = bVar15 & 0x7f;
          } while (uVar5 <= uVar12);
          uVar16 = (uint)(byte)(bVar15 * '\x02');
          uVar5 = uVar16 & 0x7e;
          if (bVar8 < 0x40) {
            uVar5 = uVar16 ^ 0x7e;
          }
          *(uint *)((long)chip + 0x46e4) = uVar5;
          *(uint *)((long)chip + 0x46d8) = uVar12;
          *(byte *)((long)chip + 0x46d4) = bVar8;
          *(uint *)((long)chip + 0x46e8) = (uint)(bVar8 >> 2);
        }
      }
      uVar5 = *(uint *)((long)chip + 0x6cc);
      uVar12 = *(int *)((long)chip + 0x6c4) + *(int *)((long)chip + 0x6c8);
      *(uint *)((long)chip + 0x6c4) = uVar12;
      if (uVar5 <= uVar12) {
        do {
          *(uint *)((long)chip + 0x6c4) = uVar12 - uVar5;
          *(int *)((long)chip + 0x6c0) = *(int *)((long)chip + 0x6c0) + 1;
          advance_eg_channel(OPN,(FM_SLOT *)CH);
          advance_eg_channel(OPN,(FM_SLOT *)CH_00);
          advance_eg_channel(OPN,(FM_SLOT *)CH_01);
          advance_eg_channel(OPN,(FM_SLOT *)CH_02);
          advance_eg_channel(OPN,(FM_SLOT *)CH_03);
          advance_eg_channel(OPN,(FM_SLOT *)CH_04);
          uVar12 = *(uint *)((long)chip + 0x6c4);
          uVar5 = *(uint *)((long)chip + 0x6cc);
        } while (uVar5 <= uVar12);
      }
      uVar5 = *(uint *)*pauVar1;
      uVar12 = 0x2000;
      if ((0x2000 < (int)uVar5) || (uVar12 = 0xffffe000, (int)uVar5 < -0x2000)) {
        uVar5 = uVar12;
        *(uint *)*pauVar1 = uVar5;
      }
      uVar12 = *(uint *)((long)chip + 0x4700);
      uVar16 = 0x2000;
      if ((0x2000 < (int)uVar12) || (uVar16 = 0xffffe000, (int)uVar12 < -0x2000)) {
        uVar12 = uVar16;
        *(uint *)((long)chip + 0x4700) = uVar12;
      }
      uVar16 = *(uint *)((long)chip + 0x4704);
      uVar13 = 0x2000;
      if ((0x2000 < (int)uVar16) || (uVar13 = 0xffffe000, (int)uVar16 < -0x2000)) {
        uVar16 = uVar13;
        *(uint *)((long)chip + 0x4704) = uVar16;
      }
      uVar13 = *(uint *)((long)chip + 0x4708);
      uVar3 = 0x2000;
      if ((0x2000 < (int)uVar13) || (uVar3 = 0xffffe000, (int)uVar13 < -0x2000)) {
        uVar13 = uVar3;
        *(uint *)((long)chip + 0x4708) = uVar13;
      }
      uVar3 = *(uint *)((long)chip + 0x470c);
      uVar17 = 0x2000;
      if ((0x2000 < (int)uVar3) || (uVar17 = 0xffffe000, (int)uVar3 < -0x2000)) {
        *(uint *)((long)chip + 0x470c) = uVar17;
        uVar3 = uVar17;
      }
      uVar17 = *(uint *)((long)chip + 0x4710);
      uVar19 = 0x2000;
      if ((0x2000 < (int)uVar17) || (uVar19 = 0xffffe000, (int)uVar17 < -0x2000)) {
        uVar17 = uVar19;
        *(uint *)((long)chip + 0x4710) = uVar17;
      }
      iVar9 = (uVar13 & *(uint *)((long)chip + 0x6ac)) + (uVar16 & *(uint *)((long)chip + 0x6a4)) +
              (uVar12 & *(uint *)((long)chip + 0x69c)) + (uVar5 & *(uint *)((long)chip + 0x694));
      uVar19 = iVar4 * 2;
      if (*(char *)((long)chip + 0x50aa) == '\0') {
        iVar9 = iVar9 + (uVar3 & *(uint *)((long)chip + 0x6b4));
        uVar19 = *(uint *)((long)chip + 0x6b0) & uVar3;
      }
      iVar10 = (*(uint *)((long)chip + 0x6b8) & uVar17) + uVar19 +
               (*(uint *)((long)chip + 0x6a0) & uVar16) + (*(uint *)((long)chip + 0x6a8) & uVar13) +
               (*(uint *)((long)chip + 0x698) & uVar12) + (*(uint *)((long)chip + 0x690) & uVar5);
      iVar9 = (uVar17 & *(uint *)((long)chip + 0x6bc)) + iVar9;
      bVar8 = *(byte *)((long)chip + 0x50b1);
      if (bVar8 == 0) {
        *(int *)((long)chip + 0x50b4) = iVar10;
        *(int *)((long)chip + 0x50b8) = iVar9;
      }
      else {
        if ((bVar8 & 1) != 0) {
          *(int *)((long)chip + 0x50b4) = iVar10;
        }
        if ((bVar8 & 2) != 0) {
          *(int *)((long)chip + 0x50b8) = iVar9;
        }
        *(byte *)((long)chip + 0x50b1) = bVar8 ^ 3;
        iVar10 = *(int *)((long)chip + 0x50b4);
      }
      local_78[uVar18] = iVar10;
      local_70[uVar18] = *(DEV_SMPL *)((long)chip + 0x50b8);
      *(char *)((long)chip + 0x684) = *(char *)((long)chip + 0x684) << 1;
      iVar9 = *(int *)((long)chip + 0x240);
      if (((iVar9 != 0) && (*(long *)((long)chip + 0x650) == 0)) &&
         (iVar11 = (int)(*(double *)((long)chip + 0x218) * 4096.0), iVar10 = iVar9 - iVar11,
         *(int *)((long)chip + 0x240) = iVar10, iVar10 == 0 || iVar9 < iVar11)) {
        if ((*(byte *)((long)chip + 0x234) & 4) == 0) {
LAB_0012f2ce:
          iVar9 = 0x400 - *(int *)((long)chip + 0x23c);
        }
        else {
          bVar8 = *(byte *)((long)chip + 0x231) | 1;
          *(byte *)((long)chip + 0x231) = bVar8;
          if ((*(char *)((long)chip + 0x224) != '\0') ||
             ((*(byte *)((long)chip + 0x225) & bVar8) == 0)) goto LAB_0012f2ce;
          *(undefined1 *)((long)chip + 0x224) = 1;
          if (*(code **)((long)chip + 0x658) == (code *)0x0) goto LAB_0012f2ce;
          (**(code **)((long)chip + 0x658))(*(undefined8 *)((long)chip + 0x210),1);
          iVar9 = 0x400 - *(int *)((long)chip + 0x23c);
          *(int *)((long)chip + 0x240) = iVar9;
          if (*(code **)((long)chip + 0x650) != (code *)0x0) {
            (**(code **)((long)chip + 0x650))
                      (*(undefined8 *)((long)chip + 0x210),0,iVar9 * *(int *)((long)chip + 0x220),
                       *(undefined4 *)((long)chip + 0x228));
            iVar9 = *(int *)((long)chip + 0x240);
          }
        }
        *(int *)((long)chip + 0x240) = iVar9 << 0xc;
        if ((*(byte *)((long)chip + 0x234) & 0x80) != 0) {
          CSMKeyControll(OPN,CH_01);
        }
      }
      if ((*(byte *)((long)chip + 0x684) & 2) != 0) {
        if ((*(char *)((long)chip + 0x4a92) == '\0') && (1 < *(byte *)((long)chip + 0x4a74))) {
          *(undefined1 *)((long)chip + 0x4a74) = 1;
          if ((*(byte *)((long)chip + 0x4a90) & 8) != 0) {
            iVar9 = *(int *)((long)chip + 0x4a7c);
            if ((*(byte *)((long)chip + 0x4a90) & 4) != *(byte *)((long)chip + 0x4a91)) {
              iVar9 = 0x200 - iVar9;
              *(int *)((long)chip + 0x4a7c) = iVar9;
            }
            if (0x1ff < iVar9) {
              *(undefined4 *)((long)chip + 0x4a7c) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4a74) = 0;
              iVar9 = 0x3ff;
            }
            *(int *)((long)chip + 0x4a84) = iVar9 + *(int *)((long)chip + 0x4a78);
          }
        }
        if ((*(char *)((long)chip + 0x4b32) == '\0') && (1 < *(byte *)((long)chip + 0x4b14))) {
          *(undefined1 *)((long)chip + 0x4b14) = 1;
          if ((*(byte *)((long)chip + 0x4b30) & 8) != 0) {
            iVar9 = *(int *)((long)chip + 0x4b1c);
            if ((*(byte *)((long)chip + 0x4b30) & 4) != *(byte *)((long)chip + 0x4b31)) {
              iVar9 = 0x200 - iVar9;
              *(int *)((long)chip + 0x4b1c) = iVar9;
            }
            if (0x1ff < iVar9) {
              *(undefined4 *)((long)chip + 0x4b1c) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4b14) = 0;
              iVar9 = 0x3ff;
            }
            *(int *)((long)chip + 0x4b24) = iVar9 + *(int *)((long)chip + 0x4b18);
          }
        }
        if ((*(char *)((long)chip + 0x4ae2) == '\0') && (1 < *(byte *)((long)chip + 0x4ac4))) {
          *(undefined1 *)((long)chip + 0x4ac4) = 1;
          if ((*(byte *)((long)chip + 0x4ae0) & 8) != 0) {
            iVar9 = *(int *)((long)chip + 0x4acc);
            if ((*(byte *)((long)chip + 0x4ae0) & 4) != *(byte *)((long)chip + 0x4ae1)) {
              iVar9 = 0x200 - iVar9;
              *(int *)((long)chip + 0x4acc) = iVar9;
            }
            if (0x1ff < iVar9) {
              *(undefined4 *)((long)chip + 0x4acc) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4ac4) = 0;
              iVar9 = 0x3ff;
            }
            *(int *)((long)chip + 0x4ad4) = iVar9 + *(int *)((long)chip + 0x4ac8);
          }
        }
        if ((*(char *)((long)chip + 0x4b82) == '\0') && (1 < *(byte *)((long)chip + 0x4b64))) {
          *(undefined1 *)((long)chip + 0x4b64) = 1;
          if ((*(byte *)((long)chip + 0x4b80) & 8) != 0) {
            iVar9 = *(int *)((long)chip + 0x4b6c);
            if ((*(byte *)((long)chip + 0x4b80) & 4) != *(byte *)((long)chip + 0x4b81)) {
              iVar9 = 0x200 - iVar9;
              *(int *)((long)chip + 0x4b6c) = iVar9;
            }
            if (0x1ff < iVar9) {
              *(undefined4 *)((long)chip + 0x4b6c) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4b64) = 0;
              iVar9 = 0x3ff;
            }
            *(int *)((long)chip + 0x4b74) = iVar9 + *(int *)((long)chip + 0x4b68);
          }
        }
        *(undefined1 *)((long)chip + 0x684) = 0;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != length);
  }
  iVar4 = *(int *)((long)chip + 0x248);
  if (iVar4 == 0) {
    return;
  }
  if (*(long *)((long)chip + 0x650) != 0) {
    return;
  }
  iVar10 = (int)((double)length * *(double *)((long)chip + 0x218) * 4096.0);
  iVar9 = iVar4 - iVar10;
  *(int *)((long)chip + 0x248) = iVar9;
  if (iVar9 != 0 && iVar10 <= iVar4) {
    return;
  }
  if ((*(byte *)((long)chip + 0x234) & 8) != 0) {
    bVar8 = *(byte *)((long)chip + 0x231) | 2;
    *(byte *)((long)chip + 0x231) = bVar8;
    if ((*(char *)((long)chip + 0x224) == '\0') && ((*(byte *)((long)chip + 0x225) & bVar8) != 0)) {
      *(undefined1 *)((long)chip + 0x224) = 1;
      if (*(code **)((long)chip + 0x658) != (code *)0x0) {
        (**(code **)((long)chip + 0x658))(*(undefined8 *)((long)chip + 0x210),1);
        iVar4 = (uint)*(byte *)((long)chip + 0x244) * -0x10 + 0x1000;
        *(int *)((long)chip + 0x248) = iVar4;
        if (*(code **)((long)chip + 0x650) != (code *)0x0) {
          (**(code **)((long)chip + 0x650))
                    (*(undefined8 *)((long)chip + 0x210),1,iVar4 * *(int *)((long)chip + 0x220),
                     *(undefined4 *)((long)chip + 0x228));
          iVar4 = *(int *)((long)chip + 0x248);
        }
        goto LAB_0012f609;
      }
    }
  }
  iVar4 = (uint)*(byte *)((long)chip + 0x244) * -0x10 + 0x1000;
LAB_0012f609:
  *(int *)((long)chip + 0x248) = iVar4 << 0xc;
  return;
}

Assistant:

void ym2612_update_one(void *chip, UINT32 length, DEV_SMPL **buffer)
{
	YM2612 *F2612 = (YM2612 *)chip;
	FM_OPN2 *OPN  = &F2612->OPN;
	INT32 *out_fm = OPN->out_fm;
	UINT32 i;
	DEV_SMPL  *bufL,*bufR;
	INT32 dacout;
	FM_CH   *cch[6];
	INT32 lt,rt;

	/* set buffer */
	if (buffer != NULL)
	{
		bufL = buffer[0];
		bufR = buffer[1];
	}
	else
	{
		// for internal 0-sample update
		bufL = bufR = NULL;
	}

	cch[0]   = &F2612->CH[0];
	cch[1]   = &F2612->CH[1];
	cch[2]   = &F2612->CH[2];
	cch[3]   = &F2612->CH[3];
	cch[4]   = &F2612->CH[4];
	cch[5]   = &F2612->CH[5];
	
	if (! F2612->MuteDAC)
		dacout = F2612->dacout << 5;    /* level unknown */
	else
		dacout = 0;

	/* refresh PG and EG */
	refresh_fc_eg_chan( OPN, cch[0] );
	refresh_fc_eg_chan( OPN, cch[1] );
	if( (OPN->ST.mode & 0xc0) )
	{
		/* 3SLOT MODE */
		if( cch[2]->SLOT[SLOT1].Incr==-1)
		{
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT1] , OPN->SL3.fc[1] , OPN->SL3.kcode[1] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT2] , OPN->SL3.fc[2] , OPN->SL3.kcode[2] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT3] , OPN->SL3.fc[0] , OPN->SL3.kcode[0] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT4] , cch[2]->fc , cch[2]->kcode );
		}
	}else refresh_fc_eg_chan( OPN, cch[2] );
	refresh_fc_eg_chan( OPN, cch[3] );
	refresh_fc_eg_chan( OPN, cch[4] );
	refresh_fc_eg_chan( OPN, cch[5] );
	if (! length)
	{
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);
	}


	/* buffering */
	for(i=0; i < length ; i++)
	{
		/* clear outputs */
		out_fm[0] = 0;
		out_fm[1] = 0;
		out_fm[2] = 0;
		out_fm[3] = 0;
		out_fm[4] = 0;
		out_fm[5] = 0;

		/* update SSG-EG output */
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);

		/* calculate FM */
		if (! F2612->dac_test)
		{
			chan_calc(F2612, OPN, cch[0]);
			chan_calc(F2612, OPN, cch[1]);
			chan_calc(F2612, OPN, cch[2]);
			chan_calc(F2612, OPN, cch[3]);
			chan_calc(F2612, OPN, cch[4]);
			if( F2612->dacen )
				*cch[5]->connect4 += dacout;
			else
				chan_calc(F2612, OPN, cch[5]);
		}
		else
		{
			out_fm[0] = out_fm[1] = dacout;
			out_fm[2] = out_fm[3] = dacout;
			out_fm[5] = dacout;
		}

		/* advance LFO */
		advance_lfo(OPN);

		/* advance envelope generator */
		OPN->eg_timer += OPN->eg_timer_add;
		while (OPN->eg_timer >= OPN->eg_timer_overflow)
		{
			OPN->eg_timer -= OPN->eg_timer_overflow;
			OPN->eg_cnt++;

			advance_eg_channel(OPN, &cch[0]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[1]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[2]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[3]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[4]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[5]->SLOT[SLOT1]);
		}

		if (out_fm[0] > 8192) out_fm[0] = 8192;
		else if (out_fm[0] < -8192) out_fm[0] = -8192;
		if (out_fm[1] > 8192) out_fm[1] = 8192;
		else if (out_fm[1] < -8192) out_fm[1] = -8192;
		if (out_fm[2] > 8192) out_fm[2] = 8192;
		else if (out_fm[2] < -8192) out_fm[2] = -8192;
		if (out_fm[3] > 8192) out_fm[3] = 8192;
		else if (out_fm[3] < -8192) out_fm[3] = -8192;
		if (out_fm[4] > 8192) out_fm[4] = 8192;
		else if (out_fm[4] < -8192) out_fm[4] = -8192;
		if (out_fm[5] > 8192) out_fm[5] = 8192;
		else if (out_fm[5] < -8192) out_fm[5] = -8192;

		/* 6-channels mixing  */
		lt  = ((out_fm[0]>>0) & OPN->pan[0]);
		rt  = ((out_fm[0]>>0) & OPN->pan[1]);
		lt += ((out_fm[1]>>0) & OPN->pan[2]);
		rt += ((out_fm[1]>>0) & OPN->pan[3]);
		lt += ((out_fm[2]>>0) & OPN->pan[4]);
		rt += ((out_fm[2]>>0) & OPN->pan[5]);
		lt += ((out_fm[3]>>0) & OPN->pan[6]);
		rt += ((out_fm[3]>>0) & OPN->pan[7]);
		if (! F2612->dac_test)
		{
			lt += ((out_fm[4]>>0) & OPN->pan[8]);
			rt += ((out_fm[4]>>0) & OPN->pan[9]);
		}
		else
		{
			// DAC test mode ignores panning for channel 4
			lt += dacout;
			lt += dacout;
		}
		lt += ((out_fm[5]>>0) & OPN->pan[10]);
		rt += ((out_fm[5]>>0) & OPN->pan[11]);

		/* buffering */
		if (F2612->WaveOutMode)
		{
			if (F2612->WaveOutMode & 0x01)
				F2612->WaveL = lt;
			if (F2612->WaveOutMode & 0x02)
				F2612->WaveR = rt;
			F2612->WaveOutMode ^= 0x03;
		}
		else
		{
			F2612->WaveL = lt;
			F2612->WaveR = rt;
		}
		bufL[i] = F2612->WaveL;
		bufR[i] = F2612->WaveR;

		/* CSM mode: if CSM Key ON has occured, CSM Key OFF need to be sent       */
		/* only if Timer A does not overflow again (i.e CSM Key ON not set again) */
		OPN->SL3.key_csm <<= 1;

		/* timer A control */
		//INTERNAL_TIMER_A( &OPN->ST , cch[2] )
		{
			if( OPN->ST.TAC && (OPN->ST.timer_handler==0) )
				if( (OPN->ST.TAC -= (int)(OPN->ST.freqbase*4096)) <= 0 )
				{
					TimerAOver( &OPN->ST );
					// CSM mode total level latch and auto key on
					if( OPN->ST.mode & 0x80 )
						CSMKeyControll( OPN, cch[2] );
				}
		}

		/* CSM Mode Key ON still disabled */
		if (OPN->SL3.key_csm & 2)
		{
			/* CSM Mode Key OFF (verified by Nemesis on real hardware) */
			FM_KEYOFF_CSM(cch[2],SLOT1);
			FM_KEYOFF_CSM(cch[2],SLOT2);
			FM_KEYOFF_CSM(cch[2],SLOT3);
			FM_KEYOFF_CSM(cch[2],SLOT4);
			OPN->SL3.key_csm = 0;
		}
	}

	/* timer B control */
	INTERNAL_TIMER_B(&OPN->ST,length)
}